

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

ostream * operator<<(ostream *os,
                    vector<Result<float,_double>,_std::allocator<Result<float,_double>_>_> *rs)

{
  pointer pRVar1;
  ostream *poVar2;
  long *plVar3;
  Result<float,_double> *r;
  pointer pRVar4;
  
  pRVar4 = (rs->super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Testing: ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(pRVar4->suiteName)._M_dataplus._M_p,(pRVar4->suiteName)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Input range: ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar2 = std::ostream::_M_insert<double>((double)(pRVar4->inputRange).first);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(pRVar4->inputRange).second);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"), ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," samples in range",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"Approximate loop and call overhead (already subtracted): ",0x39);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)pRVar4->overheadNs / (float)pRVar4->samplesInRange));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ns / call",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Tested functions:",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  pRVar1 = (rs->super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (rs->
                super__Vector_base<Result<float,_double>,_std::allocator<Result<float,_double>_>_>).
                _M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
    poVar2 = operator<<(os,pRVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<Result<InputT, StorageT>>& rs)
{
    const auto& fr = rs.front();
    os << "Testing: " << fr.suiteName << std::endl;
    os << "Input range: ";
    os << "(" << fr.inputRange.first << ", " << fr.inputRange.second << "), ";
    os << fr.samplesInRange << " samples in range" << std::endl;
    os << "Approximate loop and call overhead (already subtracted): " << float(fr.overheadNs) / float(fr.samplesInRange) << " ns / call" << std::endl;
    os << "Tested functions:" << std::endl
       << std::endl;
    for (const auto& r : rs)
    {
        os << r << std::endl;
    }
    return os;
}